

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

string * __thiscall
GdlRule::GlyphMetricDebugString_abi_cxx11_(string *__return_storage_ptr__,GdlRule *this,int gmet)

{
  char *pcVar1;
  string local_30;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "lsb";
    break;
  case 1:
    pcVar1 = "rsb";
    break;
  case 2:
    pcVar1 = "bb_top";
    break;
  case 3:
    pcVar1 = "bb_bottom";
    break;
  case 4:
    pcVar1 = "bb_left";
    break;
  case 5:
    pcVar1 = "bb_right";
    break;
  case 6:
    pcVar1 = "bb_height";
    break;
  case 7:
    pcVar1 = "bb_width";
    break;
  case 8:
    pcVar1 = "aw";
    break;
  case 9:
    pcVar1 = "ah";
    break;
  case 10:
    pcVar1 = "ascent";
    break;
  case 0xb:
    pcVar1 = "descent";
    break;
  default:
    std::__cxx11::to_string(&local_30,(int)this);
    std::operator+(__return_storage_ptr__,"bad-glyph-metric-",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GdlRule::GlyphMetricDebugString(int gmet)
{
	switch (gmet)
	{
	case kgmetLsb:				return "lsb";
	case kgmetRsb:				return "rsb";
	case kgmetBbTop:			return "bb_top";
	case kgmetBbBottom:			return "bb_bottom";
	case kgmetBbLeft:			return "bb_left";
	case kgmetBbRight:			return "bb_right";
	case kgmetBbHeight:			return "bb_height";
	case kgmetBbWidth:			return "bb_width";
	case kgmetAdvWidth:			return "aw";
	case kgmetAdvHeight:		return "ah";
	case kgmetAscent:			return "ascent";
	case kgmetDescent:			return "descent";
	default:
		Assert(false);
		return "bad-glyph-metric-" + std::to_string(gmet);
	}
}